

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O0

void MurmurHash3_x86_128(void *key,int len,uint32_t seed,void *out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  byte *pbVar11;
  int *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t k4;
  uint32_t k3;
  uint32_t k2;
  uint32_t k1;
  uint8_t *tail;
  uint32_t k4_1;
  uint32_t k3_1;
  uint32_t k2_1;
  uint32_t k1_1;
  int i;
  uint32_t *blocks;
  uint32_t c4;
  uint32_t c3;
  uint32_t c2;
  uint32_t c1;
  uint32_t h4;
  uint32_t h3;
  uint32_t h2;
  uint32_t h1;
  int nblocks;
  uint8_t *data;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  int local_a4;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  
  iVar4 = (int)in_ESI / 0x10;
  lVar10 = in_RDI + (iVar4 << 4);
  local_84 = in_EDX;
  local_80 = in_EDX;
  local_7c = in_EDX;
  local_78 = in_EDX;
  for (local_a4 = -iVar4; local_a4 != 0; local_a4 = local_a4 + 1) {
    iVar1 = *(int *)(lVar10 + (long)(local_a4 * 4 + 1) * 4);
    iVar2 = *(int *)(lVar10 + (long)(local_a4 * 4 + 2) * 4);
    iVar3 = *(int *)(lVar10 + (long)(local_a4 * 4 + 3) * 4);
    uVar5 = rotl32(*(int *)(lVar10 + (long)(local_a4 << 2) * 4) * 0x239b961b,'\x0f');
    uVar5 = rotl32(uVar5 * -0x54f16877 ^ local_78,'\x13');
    local_78 = (local_7c + uVar5) * 5 + 0x561ccd1b;
    uVar5 = rotl32(iVar1 * -0x54f16877,'\x10');
    uVar5 = rotl32(uVar5 * 0x38b34ae5 ^ local_7c,'\x11');
    local_7c = (local_80 + uVar5) * 5 + 0xbcaa747;
    uVar5 = rotl32(iVar2 * 0x38b34ae5,'\x11');
    uVar5 = rotl32(uVar5 * -0x5e1c746d ^ local_80,'\x0f');
    local_80 = (local_84 + uVar5) * 5 + 0x96cd1c35;
    uVar5 = rotl32(iVar3 * -0x5e1c746d,'\x12');
    uVar5 = rotl32(uVar5 * 0x239b961b ^ local_84,'\r');
    local_84 = (local_78 + uVar5) * 5 + 0x32ac3b17;
  }
  pbVar11 = (byte *)(in_RDI + (iVar4 << 4));
  local_c4 = 0;
  local_c8 = 0;
  local_cc = 0;
  local_d0 = 0;
  switch(in_ESI & 0xf) {
  case 0xf:
    local_d0 = (uint)pbVar11[0xe] << 0x10;
  case 0xe:
    local_d0 = (uint)pbVar11[0xd] << 8 ^ local_d0;
  case 0xd:
    uVar5 = rotl32((pbVar11[0xc] ^ local_d0) * -0x5e1c746d,'\x12');
    local_84 = uVar5 * 0x239b961b ^ local_84;
  case 0xc:
    local_cc = (uint)pbVar11[0xb] << 0x18;
  case 0xb:
    local_cc = (uint)pbVar11[10] << 0x10 ^ local_cc;
  case 10:
    local_cc = (uint)pbVar11[9] << 8 ^ local_cc;
  case 9:
    uVar5 = rotl32((pbVar11[8] ^ local_cc) * 0x38b34ae5,'\x11');
    local_80 = uVar5 * -0x5e1c746d ^ local_80;
  case 8:
    local_c8 = (uint)pbVar11[7] << 0x18;
  case 7:
    local_c8 = (uint)pbVar11[6] << 0x10 ^ local_c8;
  case 6:
    local_c8 = (uint)pbVar11[5] << 8 ^ local_c8;
  case 5:
    uVar5 = rotl32((pbVar11[4] ^ local_c8) * -0x54f16877,'\x10');
    local_7c = uVar5 * 0x38b34ae5 ^ local_7c;
  case 4:
    local_c4 = (uint)pbVar11[3] << 0x18;
  case 3:
    local_c4 = (uint)pbVar11[2] << 0x10 ^ local_c4;
  case 2:
    local_c4 = (uint)pbVar11[1] << 8 ^ local_c4;
  case 1:
    uVar5 = rotl32((*pbVar11 ^ local_c4) * 0x239b961b,'\x0f');
    local_78 = uVar5 * -0x54f16877 ^ local_78;
  default:
    uVar6 = (in_ESI ^ local_84) + (in_ESI ^ local_80) + (in_ESI ^ local_7c) + (in_ESI ^ local_78);
    uVar7 = uVar6 + (in_ESI ^ local_7c);
    uVar8 = uVar6 + (in_ESI ^ local_80);
    uVar9 = uVar6 + (in_ESI ^ local_84);
    uVar6 = (uVar6 >> 0x10 ^ uVar6) * -0x7a143595;
    uVar6 = (uVar6 >> 0xd ^ uVar6) * -0x3d4d51cb;
    uVar7 = (uVar7 >> 0x10 ^ uVar7) * -0x7a143595;
    uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
    uVar7 = uVar7 >> 0x10 ^ uVar7;
    uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
    uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
    uVar8 = uVar8 >> 0x10 ^ uVar8;
    uVar9 = (uVar9 >> 0x10 ^ uVar9) * -0x7a143595;
    uVar9 = (uVar9 >> 0xd ^ uVar9) * -0x3d4d51cb;
    uVar9 = uVar9 >> 0x10 ^ uVar9;
    iVar4 = uVar9 + uVar8 + uVar7 + (uVar6 >> 0x10 ^ uVar6);
    *in_RCX = iVar4;
    in_RCX[1] = iVar4 + uVar7;
    in_RCX[2] = iVar4 + uVar8;
    in_RCX[3] = iVar4 + uVar9;
    return;
  }
}

Assistant:

void MurmurHash3_x86_128(const void* key, const int len,
	uint32_t seed, void* out)
{
	const uint8_t* data = (const uint8_t*)key;
	const int nblocks = len / 16;

	uint32_t h1 = seed;
	uint32_t h2 = seed;
	uint32_t h3 = seed;
	uint32_t h4 = seed;

	const uint32_t c1 = 0x239b961b;
	const uint32_t c2 = 0xab0e9789;
	const uint32_t c3 = 0x38b34ae5;
	const uint32_t c4 = 0xa1e38b93;
	const uint32_t* blocks = (const uint32_t*)(data + nblocks * 16);

	for (int i = -nblocks; i; i++)
	{
		uint32_t k1 = getblock32(blocks, i * 4 + 0);
		uint32_t k2 = getblock32(blocks, i * 4 + 1);
		uint32_t k3 = getblock32(blocks, i * 4 + 2);
		uint32_t k4 = getblock32(blocks, i * 4 + 3);

		k1 *= c1; k1 = ROTL32(k1, 15); k1 *= c2; h1 ^= k1;
		h1 = ROTL32(h1, 19); h1 += h2; h1 = h1 * 5 + 0x561ccd1b;
		k2 *= c2; k2 = ROTL32(k2, 16); k2 *= c3; h2 ^= k2;
		h2 = ROTL32(h2, 17); h2 += h3; h2 = h2 * 5 + 0x0bcaa747;
		k3 *= c3; k3 = ROTL32(k3, 17); k3 *= c4; h3 ^= k3;
		h3 = ROTL32(h3, 15); h3 += h4; h3 = h3 * 5 + 0x96cd1c35;
		k4 *= c4; k4 = ROTL32(k4, 18); k4 *= c1; h4 ^= k4;
		h4 = ROTL32(h4, 13); h4 += h1; h4 = h4 * 5 + 0x32ac3b17;
	}

	const uint8_t* tail = (const uint8_t*)(data + nblocks * 16);

	uint32_t k1 = 0;
	uint32_t k2 = 0;
	uint32_t k3 = 0;
	uint32_t k4 = 0;

	switch (len & 15)
	{
	case 15: k4 ^= tail[14] << 16;
	case 14: k4 ^= tail[13] << 8;
	case 13: k4 ^= tail[12] << 0;
		k4 *= c4; k4 = ROTL32(k4, 18); k4 *= c1; h4 ^= k4;

	case 12: k3 ^= tail[11] << 24;
	case 11: k3 ^= tail[10] << 16;
	case 10: k3 ^= tail[9] << 8;
	case  9: k3 ^= tail[8] << 0;
		k3 *= c3; k3 = ROTL32(k3, 17); k3 *= c4; h3 ^= k3;

	case  8: k2 ^= tail[7] << 24;
	case  7: k2 ^= tail[6] << 16;
	case  6: k2 ^= tail[5] << 8;
	case  5: k2 ^= tail[4] << 0;
		k2 *= c2; k2 = ROTL32(k2, 16); k2 *= c3; h2 ^= k2;

	case  4: k1 ^= tail[3] << 24;
	case  3: k1 ^= tail[2] << 16;
	case  2: k1 ^= tail[1] << 8;
	case  1: k1 ^= tail[0] << 0;
		k1 *= c1; k1 = ROTL32(k1, 15); k1 *= c2; h1 ^= k1;
	};

	h1 ^= len; h2 ^= len; h3 ^= len; h4 ^= len;

	h1 += h2; h1 += h3; h1 += h4;
	h2 += h1; h3 += h1; h4 += h1;

	h1 = fmix32(h1);
	h2 = fmix32(h2);
	h3 = fmix32(h3);
	h4 = fmix32(h4);

	h1 += h2; h1 += h3; h1 += h4;
	h2 += h1; h3 += h1; h4 += h1;

	((uint32_t*)out)[0] = h1;
	((uint32_t*)out)[1] = h2;
	((uint32_t*)out)[2] = h3;
	((uint32_t*)out)[3] = h4;
}